

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void empty_readdir_cb(uv_fs_t *req)

{
  void *pvVar1;
  int iVar2;
  undefined8 uVar3;
  uv_fs_t *puVar4;
  code **ppcVar5;
  int64_t eval_b;
  int64_t eval_a;
  code *pcStack_20;
  undefined8 local_18;
  void *local_10;
  
  pvVar1 = readdir_req.ptr;
  if (req == &readdir_req) {
    local_10 = (void *)(long)readdir_req.fs_type;
    local_18 = 0x20;
    if (local_10 != (void *)0x20) goto LAB_0018c8d7;
    local_10 = (void *)readdir_req.result;
    local_18 = 0;
    if (readdir_req.result != 0) goto LAB_0018c8e4;
    pcStack_20 = (code *)0x18c894;
    uv_fs_req_cleanup(&readdir_req);
    pcStack_20 = (code *)0x18c899;
    uVar3 = uv_default_loop();
    pcStack_20 = (code *)0x18c8b2;
    iVar2 = uv_fs_closedir(uVar3,&closedir_req,pvVar1,empty_closedir_cb);
    local_10 = (void *)(long)iVar2;
    local_18 = 0;
    if (local_10 == (void *)0x0) {
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x18c8d7;
    empty_readdir_cb_cold_1();
LAB_0018c8d7:
    pcStack_20 = (code *)0x18c8e4;
    empty_readdir_cb_cold_2();
LAB_0018c8e4:
    pcStack_20 = (code *)0x18c8f1;
    empty_readdir_cb_cold_3();
  }
  puVar4 = (uv_fs_t *)&stack0xfffffffffffffff0;
  pcStack_20 = empty_closedir_cb;
  empty_readdir_cb_cold_4();
  if (puVar4 == &closedir_req) {
    pcStack_20 = (code *)(long)closedir_req.fs_type;
    if (pcStack_20 == (code *)0x21) {
      pcStack_20 = (code *)closedir_req.result;
      if (closedir_req.result == 0) {
        empty_closedir_cb_count = empty_closedir_cb_count + 1;
        uv_fs_req_cleanup(&closedir_req);
        return;
      }
      goto LAB_0018c97a;
    }
  }
  else {
    empty_closedir_cb_cold_1();
  }
  empty_closedir_cb_cold_2();
LAB_0018c97a:
  ppcVar5 = &pcStack_20;
  empty_closedir_cb_cold_3();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return;
  }
  uv_close(ppcVar5,0);
  return;
}

Assistant:

static void empty_readdir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &readdir_req);
  ASSERT_EQ(req->fs_type, UV_FS_READDIR);
  ASSERT_OK(req->result);
  dir = req->ptr;
  uv_fs_req_cleanup(req);
  r = uv_fs_closedir(uv_default_loop(),
                     &closedir_req,
                     dir,
                     empty_closedir_cb);
  ASSERT_OK(r);
}